

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool parse_array(cJSON *item,parse_buffer *input_buffer)

{
  cJSON *pcVar1;
  cJSON_bool cVar2;
  cJSON *item_00;
  bool bVar3;
  cJSON *new_item;
  cJSON *current_item;
  cJSON *head;
  parse_buffer *input_buffer_local;
  cJSON *item_local;
  
  current_item = (cJSON *)0x0;
  new_item = (cJSON *)0x0;
  if (999 < input_buffer->depth) {
    return 0;
  }
  input_buffer->depth = input_buffer->depth + 1;
  if (input_buffer->content[input_buffer->offset] == '[') {
    input_buffer->offset = input_buffer->offset + 1;
    buffer_skip_whitespace(input_buffer);
    if (((input_buffer != (parse_buffer *)0x0) && (input_buffer->offset < input_buffer->length)) &&
       (input_buffer->content[input_buffer->offset] == ']')) {
LAB_001074fd:
      input_buffer->depth = input_buffer->depth - 1;
      item->type = 0x20;
      item->child = current_item;
      input_buffer->offset = input_buffer->offset + 1;
      return 1;
    }
    if ((input_buffer == (parse_buffer *)0x0) || (input_buffer->length <= input_buffer->offset)) {
      input_buffer->offset = input_buffer->offset - 1;
    }
    else {
      input_buffer->offset = input_buffer->offset - 1;
      do {
        item_00 = cJSON_New_Item(&input_buffer->hooks);
        if (item_00 == (cJSON *)0x0) goto LAB_0010753d;
        pcVar1 = item_00;
        if (current_item != (cJSON *)0x0) {
          new_item->next = item_00;
          item_00->prev = new_item;
          pcVar1 = current_item;
        }
        current_item = pcVar1;
        input_buffer->offset = input_buffer->offset + 1;
        buffer_skip_whitespace(input_buffer);
        cVar2 = parse_value(item_00,input_buffer);
        if (cVar2 == 0) goto LAB_0010753d;
        buffer_skip_whitespace(input_buffer);
        bVar3 = false;
        if ((input_buffer != (parse_buffer *)0x0) &&
           (bVar3 = false, input_buffer->offset < input_buffer->length)) {
          bVar3 = input_buffer->content[input_buffer->offset] == ',';
        }
        new_item = item_00;
      } while (bVar3);
      if (((input_buffer != (parse_buffer *)0x0) && (input_buffer->offset < input_buffer->length))
         && (input_buffer->content[input_buffer->offset] == ']')) goto LAB_001074fd;
    }
  }
LAB_0010753d:
  if (current_item != (cJSON *)0x0) {
    cJSON_Delete(current_item);
  }
  return 0;
}

Assistant:

static cJSON_bool parse_array(cJSON * const item, parse_buffer * const input_buffer)
{
    cJSON *head = NULL; /* head of the linked list */
    cJSON *current_item = NULL;

    if (input_buffer->depth >= CJSON_NESTING_LIMIT)
    {
        return false; /* to deeply nested */
    }
    input_buffer->depth++;

    if (buffer_at_offset(input_buffer)[0] != '[')
    {
        /* not an array */
        goto fail;
    }

    input_buffer->offset++;
    buffer_skip_whitespace(input_buffer);
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == ']'))
    {
        /* empty array */
        goto success;
    }

    /* check if we skipped to the end of the buffer */
    if (cannot_access_at_index(input_buffer, 0))
    {
        input_buffer->offset--;
        goto fail;
    }

    /* step back to character in front of the first element */
    input_buffer->offset--;
    /* loop through the comma separated array elements */
    do
    {
        /* allocate next item */
        cJSON *new_item = cJSON_New_Item(&(input_buffer->hooks));
        if (new_item == NULL)
        {
            goto fail; /* allocation failure */
        }

        /* attach next item to list */
        if (head == NULL)
        {
            /* start the linked list */
            current_item = head = new_item;
        }
        else
        {
            /* add to the end and advance */
            current_item->next = new_item;
            new_item->prev = current_item;
            current_item = new_item;
        }

        /* parse next value */
        input_buffer->offset++;
        buffer_skip_whitespace(input_buffer);
        if (!parse_value(current_item, input_buffer))
        {
            goto fail; /* failed to parse value */
        }
        buffer_skip_whitespace(input_buffer);
    }
    while (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == ','));

    if (cannot_access_at_index(input_buffer, 0) || buffer_at_offset(input_buffer)[0] != ']')
    {
        goto fail; /* expected end of array */
    }

success:
    input_buffer->depth--;

    item->type = cJSON_Array;
    item->child = head;

    input_buffer->offset++;

    return true;

fail:
    if (head != NULL)
    {
        cJSON_Delete(head);
    }

    return false;
}